

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

bool __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::process_back_slash
          (lexical_analyzer_t<cfgfile::string_trait_t> *this,char_t *ch)

{
  bool bVar1;
  char_t cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_RSI;
  input_stream_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_fffffffffffffe38;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  input_stream_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe48;
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator local_199;
  string local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  allocator local_131;
  string local_130 [87];
  undefined1 local_d9 [193];
  char *local_18;
  
  local_18 = in_RSI;
  bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(in_stack_fffffffffffffe48);
  if (bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    this_00 = (exception_t<cfgfile::string_trait_t> *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_d9 + 1),
               "Unexpected end of file. Unfinished back slash sequence. In file \"",
               (allocator *)this_00);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_
              ((input_stream_t<cfgfile::string_trait_t> *)in_RDI->m_stream);
    std::operator+(__lhs,in_stack_fffffffffffffe40);
    paVar3 = &local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"\" on line ",paVar3);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    input_stream_t<cfgfile::string_trait_t>::line_number
              ((input_stream_t<cfgfile::string_trait_t> *)in_RDI->m_stream);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    paVar3 = &local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,".",paVar3);
    string_trait_t::from_ascii((string *)paVar3);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,__lhs);
    __cxa_throw(__lhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  cVar2 = input_stream_t<cfgfile::string_trait_t>::get(in_RDI);
  *local_18 = cVar2;
  if (*local_18 == const_t<cfgfile::string_trait_t>::c_n) {
    *local_18 = const_t<cfgfile::string_trait_t>::c_carriage_return;
  }
  else if (*local_18 == const_t<cfgfile::string_trait_t>::c_t) {
    *local_18 = const_t<cfgfile::string_trait_t>::c_tab;
  }
  else if (*local_18 == const_t<cfgfile::string_trait_t>::c_r) {
    *local_18 = const_t<cfgfile::string_trait_t>::c_line_feed;
  }
  else if (*local_18 == const_t<cfgfile::string_trait_t>::c_quotes) {
    *local_18 = const_t<cfgfile::string_trait_t>::c_quotes;
  }
  else {
    if (*local_18 != const_t<cfgfile::string_trait_t>::c_back_slash) {
      return false;
    }
    *local_18 = const_t<cfgfile::string_trait_t>::c_back_slash;
  }
  return true;
}

Assistant:

bool process_back_slash( typename Trait::char_t & ch )
	{
		if( m_stream.at_end() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Unfinished back slash sequence. In file \"" ) +
				m_stream.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_stream.line_number() ) +
				Trait::from_ascii( "." ) );

		ch = m_stream.get();

		if( ch == const_t< Trait >::c_n )
			ch = const_t< Trait >::c_carriage_return;
		else if( ch == const_t< Trait >::c_t )
			ch = const_t< Trait >::c_tab;
		else if( ch == const_t< Trait >::c_r )
			ch = const_t< Trait >::c_line_feed;
		else if( ch == const_t< Trait >::c_quotes )
			ch = const_t< Trait >::c_quotes;
		else if( ch == const_t< Trait >::c_back_slash )
			ch = const_t< Trait >::c_back_slash;
		else
			return false;

		return true;
	}